

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O2

void If_ManSatTest2(void)

{
  int iVar1;
  sat_solver *s;
  word *pTruth;
  Vec_Int_t *vLits;
  word uFree;
  word uBound;
  
  s = (sat_solver *)If_ManSatBuildXY(4);
  iVar1 = 0x7b3546;
  pTruth = Dau_DsdToTruth("0123456789ABCDEF{abcdef}",6);
  vLits = Vec_IntAlloc(iVar1);
  iVar1 = If_ManSatCheckXY(s,4,pTruth,6,0x5d,&uBound,&uFree,vLits);
  if (iVar1 != 0) {
    Dau_DsdPrintFromTruth(pTruth,6);
    Dau_DsdPrintFromTruth(&uBound,4);
    Dau_DsdPrintFromTruth(&uFree,4);
    sat_solver_delete(s);
    Vec_IntFree(vLits);
    return;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                ,0x1fe,"void If_ManSatTest2()");
}

Assistant:

void If_ManSatTest2()
{
    int nVars = 6;
    int nLutSize = 4;
    sat_solver * p = (sat_solver *)If_ManSatBuildXY( nLutSize );
//    char * pDsd = "(abcdefg)";
//    char * pDsd = "([a!bc]d!e)";
    char * pDsd = "0123456789ABCDEF{abcdef}";
    word * pTruth = Dau_DsdToTruth( pDsd, nVars );
    word uBound, uFree;
    Vec_Int_t * vLits = Vec_IntAlloc( 100 );
//    unsigned uSet = (1 << 0) | (1 << 2) | (1 << 4) | (1 << 6);
//    unsigned uSet = (3 << 0) | (1 << 2) | (1 << 8) | (1 << 4);
    unsigned uSet = (1 << 0) | (3 << 2) | (1 << 4) | (1 << 6);
    int RetValue = If_ManSatCheckXY( p, nLutSize, pTruth, nVars, uSet, &uBound, &uFree, vLits );
    assert( RetValue );
    
//    Abc_TtPrintBinary( pTruth, nVars );
//    Abc_TtPrintBinary( &uBound, nLutSize );
//    Abc_TtPrintBinary( &uFree, nLutSize );

    Dau_DsdPrintFromTruth( pTruth, nVars );
    Dau_DsdPrintFromTruth( &uBound, nLutSize );
    Dau_DsdPrintFromTruth( &uFree, nLutSize );
    sat_solver_delete(p);
    Vec_IntFree( vLits );
}